

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

bool __thiscall
spvtools::val::Function::IsCompatibleWithExecutionModel
          (Function *this,ExecutionModel model,string *reason)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string local_220 [36];
  int local_1fc;
  undefined1 local_1f8 [8];
  string message;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  *is_compatible;
  const_iterator __end2;
  const_iterator __begin2;
  list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  *__range2;
  stringstream ss_reason;
  ostream aoStack_1a8 [383];
  byte local_29;
  string *psStack_28;
  bool return_value;
  string *reason_local;
  Function *pFStack_18;
  ExecutionModel model_local;
  Function *this_local;
  
  local_29 = 1;
  psStack_28 = reason;
  reason_local._4_4_ = model;
  pFStack_18 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
  __end2 = std::__cxx11::
           list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
           ::begin(&this->execution_model_limitations_);
  is_compatible =
       (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
        *)std::__cxx11::
          list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
          ::end(&this->execution_model_limitations_);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&is_compatible), bVar1) {
    message.field_2._8_8_ =
         std::
         _List_const_iterator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>
         ::operator*(&__end2);
    std::__cxx11::string::string((string *)local_1f8);
    bVar1 = std::
            function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
            ::operator()((function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)message.field_2._8_8_,reason_local._4_4_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
    if (bVar1) {
LAB_00b7c293:
      local_1fc = 0;
    }
    else {
      if (psStack_28 != (string *)0x0) {
        local_29 = 0;
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          poVar3 = std::operator<<(aoStack_1a8,(string *)local_1f8);
          std::operator<<(poVar3,"\n");
        }
        goto LAB_00b7c293;
      }
      this_local._7_1_ = 0;
      local_1fc = 1;
    }
    std::__cxx11::string::~string((string *)local_1f8);
    if (local_1fc != 0) goto LAB_00b7c316;
    std::
    _List_const_iterator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>
    ::operator++(&__end2);
  }
  if (((local_29 & 1) == 0) && (psStack_28 != (string *)0x0)) {
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)psStack_28,local_220);
    std::__cxx11::string::~string(local_220);
  }
  this_local._7_1_ = local_29 & 1;
  local_1fc = 1;
LAB_00b7c316:
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Function::IsCompatibleWithExecutionModel(spv::ExecutionModel model,
                                              std::string* reason) const {
  bool return_value = true;
  std::stringstream ss_reason;

  for (const auto& is_compatible : execution_model_limitations_) {
    std::string message;
    if (!is_compatible(model, &message)) {
      if (!reason) return false;
      return_value = false;
      if (!message.empty()) {
        ss_reason << message << "\n";
      }
    }
  }

  if (!return_value && reason) {
    *reason = ss_reason.str();
  }

  return return_value;
}